

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O0

size_t TtfUtil::LocaLookup(gid16 nGlyphId,void *pLoca,size_t lLocaSize,void *pHead)

{
  int16 iVar1;
  uint16 uVar2;
  uint32 uVar3;
  out_of_range *this;
  ulong in_RDX;
  ushort in_DI;
  uint32 *pLongTable;
  uint16 *pShortTable;
  FontHeader *pTable;
  ulong local_8;
  
  iVar1 = read<short>(0);
  if ((iVar1 == 0) && ((ulong)in_DI <= (in_RDX >> 1) - 1)) {
    uVar2 = read<unsigned_short>(0);
    local_8 = (ulong)(int)((uint)uVar2 << 1);
  }
  else {
    iVar1 = read<short>(0);
    if ((iVar1 != 1) || ((in_RDX >> 2) - 1 < (ulong)in_DI)) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"glyph id out of range for font");
      __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    uVar3 = read<unsigned_int>(0);
    local_8 = (ulong)uVar3;
  }
  return local_8;
}

Assistant:

size_t LocaLookup(gr::gid16 nGlyphId, 
		const void * pLoca, size_t lLocaSize, 
		const void * pHead)
{
	const Sfnt::FontHeader * pTable = reinterpret_cast<const Sfnt::FontHeader *>(pHead);

	// CheckTable verifies the index_to_loc_format is valid
	if (read(pTable->index_to_loc_format) == Sfnt::FontHeader::ShortIndexLocFormat)
	{ // loca entries are two bytes and have been divided by two
		if (nGlyphId <= (lLocaSize >> 1) - 1) // allow sentinel value to be accessed
		{
			const uint16 * pShortTable = reinterpret_cast<const uint16 *>(pLoca);
			return (read(pShortTable[nGlyphId]) << 1);
		}
	}
	
	if (read(pTable->index_to_loc_format) == Sfnt::FontHeader::LongIndexLocFormat)
	{ // loca entries are four bytes
		if (nGlyphId <= (lLocaSize >> 2) - 1)
		{
			const uint32 * pLongTable = reinterpret_cast<const uint32 *>(pLoca);
			return read(pLongTable[nGlyphId]);
		}
	}

	// only get here if glyph id was bad
	//return -1;
	throw std::out_of_range("glyph id out of range for font");
}